

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerSettings.cpp
# Opt level: O0

void __thiscall USBAnalyzerSettings::USBAnalyzerSettings(USBAnalyzerSettings *this)

{
  USBAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__USBAnalyzerSettings_0018e3a0;
  Channel::Channel(&this->mDPChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mDMChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mSpeed = LOW_SPEED;
  this->mDecodeLevel = OUT_CONTROL_TRANSFERS;
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mDPChannelInterface);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mDMChannelInterface);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(&this->mSpeedInterface);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList
            (&this->mDecodeLevelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mDPChannelInterface,"D+");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mDPChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mDMChannelInterface,"D-");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mDMChannelInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mSpeedInterface,"USB bit-rate");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)&this->mSpeedInterface,"Low speed (1.5 Mbps)");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)&this->mSpeedInterface,"Full speed (12 Mbps)");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mSpeed);
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)&this->mDecodeLevelInterface,"USB decode level");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (3.0,(char *)&this->mDecodeLevelInterface,"Control transfers");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)&this->mDecodeLevelInterface,"Packets");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)&this->mDecodeLevelInterface,"Bytes");
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)&this->mDecodeLevelInterface,"Signals");
  AnalyzerSettingInterfaceNumberList::SetNumber(3.0);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddExportOption((uint)this,(char *)0x0);
  AnalyzerSettings::AddExportExtension((uint)this,(char *)0x0,"text");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDPChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDMChannel,true);
  return;
}

Assistant:

USBAnalyzerSettings::USBAnalyzerSettings()
    : mDMChannel( UNDEFINED_CHANNEL ), mDPChannel( UNDEFINED_CHANNEL ), mSpeed( LOW_SPEED ), mDecodeLevel( OUT_CONTROL_TRANSFERS )
{
    // init the interface
    mDPChannelInterface.SetTitleAndTooltip( "D+", "USB D+ (green)" );
    mDPChannelInterface.SetChannel( mDPChannel );

    mDMChannelInterface.SetTitleAndTooltip( "D-", "USB D- (white)" );
    mDMChannelInterface.SetChannel( mDMChannel );

    mSpeedInterface.SetTitleAndTooltip( "USB bit-rate", "USB data bit-rate" );
    mSpeedInterface.AddNumber( LOW_SPEED, "Low speed (1.5 Mbps)", "Low speed (1.5 mbit/s)" );
    mSpeedInterface.AddNumber( FULL_SPEED, "Full speed (12 Mbps)", "Full speed (12 mbit/s)" );

    mSpeedInterface.SetNumber( mSpeed );

    mDecodeLevelInterface.SetTitleAndTooltip( "USB decode level", "Type of decoded USB output" );
    mDecodeLevelInterface.AddNumber( OUT_CONTROL_TRANSFERS, "Control transfers", "Decodes the standard USB enpoint 0 control transfers." );
    mDecodeLevelInterface.AddNumber( OUT_PACKETS, "Packets", "Decode all the fields of USB packets" );
    mDecodeLevelInterface.AddNumber( OUT_BYTES, "Bytes", "Decode the data as raw bytes" );
    mDecodeLevelInterface.AddNumber( OUT_SIGNALS, "Signals", "Decode the USB signal states: J, K and SE0" );

    mDecodeLevelInterface.SetNumber( OUT_CONTROL_TRANSFERS );

    // add the interface
    AddInterface( &mDPChannelInterface );
    AddInterface( &mDMChannelInterface );
    AddInterface( &mSpeedInterface );
    AddInterface( &mDecodeLevelInterface );

    // describe export
    AddExportOption( 0, "Export as text file" );
    AddExportExtension( 0, "text", "txt" );

    ClearChannels();

    AddChannel( mDPChannel, "D+", false );
    AddChannel( mDMChannel, "D-", false );
}